

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt__csctx_rccurve_to
               (stbtt__csctx *ctx,float dx1,float dy1,float dx2,float dy2,float dx3,float dy3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = dx1 + ctx->x;
  fVar2 = dy1 + ctx->y;
  fVar3 = dx2 + fVar1;
  fVar4 = dy2 + fVar2;
  fVar5 = dx3 + fVar3;
  ctx->x = fVar5;
  fVar6 = dy3 + fVar4;
  ctx->y = fVar6;
  stbtt__csctx_v(ctx,'\x04',(int)fVar5,(int)fVar6,(int)fVar1,(int)fVar2,(int)fVar3,(int)fVar4);
  return;
}

Assistant:

static void stbtt__csctx_rccurve_to(stbtt__csctx *ctx, float dx1, float dy1, float dx2, float dy2, float dx3, float dy3)
{
   float cx1 = ctx->x + dx1;
   float cy1 = ctx->y + dy1;
   float cx2 = cx1 + dx2;
   float cy2 = cy1 + dy2;
   ctx->x = cx2 + dx3;
   ctx->y = cy2 + dy3;
   stbtt__csctx_v(ctx, STBTT_vcubic, (int)ctx->x, (int)ctx->y, (int)cx1, (int)cy1, (int)cx2, (int)cy2);
}